

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr xmlCreateURLParserCtxt(char *filename,int options)

{
  xmlParserInputPtr value;
  char *local_38;
  char *directory;
  xmlParserInputPtr inputStream;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *filename_local;
  
  local_38 = (char *)0x0;
  filename_local = (char *)xmlNewParserCtxt();
  if ((xmlParserCtxtPtr)filename_local == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory((xmlParserCtxtPtr)0x0,"cannot allocate parser context");
    filename_local = (char *)0x0;
  }
  else {
    if (options != 0) {
      xmlCtxtUseOptionsInternal((xmlParserCtxtPtr)filename_local,options,(char *)0x0);
    }
    ((xmlParserCtxtPtr)filename_local)->linenumbers = 1;
    value = xmlLoadExternalEntity(filename,(char *)0x0,(xmlParserCtxtPtr)filename_local);
    if (value == (xmlParserInputPtr)0x0) {
      xmlFreeParserCtxt((xmlParserCtxtPtr)filename_local);
      filename_local = (char *)0x0;
    }
    else {
      inputPush((xmlParserCtxtPtr)filename_local,value);
      if (((xmlParserCtxtPtr)filename_local)->directory == (char *)0x0) {
        local_38 = xmlParserGetDirectory(filename);
      }
      if ((((xmlParserCtxtPtr)filename_local)->directory == (char *)0x0) &&
         (local_38 != (char *)0x0)) {
        ((xmlParserCtxtPtr)filename_local)->directory = local_38;
      }
    }
  }
  return (xmlParserCtxtPtr)filename_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreateURLParserCtxt(const char *filename, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    char *directory = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
	xmlErrMemory(NULL, "cannot allocate parser context");
	return(NULL);
    }

    if (options)
	xmlCtxtUseOptionsInternal(ctxt, options, NULL);
    ctxt->linenumbers = 1;

    inputStream = xmlLoadExternalEntity(filename, NULL, ctxt);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputPush(ctxt, inputStream);
    if ((ctxt->directory == NULL) && (directory == NULL))
        directory = xmlParserGetDirectory(filename);
    if ((ctxt->directory == NULL) && (directory != NULL))
        ctxt->directory = directory;

    return(ctxt);
}